

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::verifyTriangleGroupRasterization
               (Surface *surface,TriangleSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               VerificationMode mode)

{
  size_t *this;
  RGBA RVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  MessageBuilder *pMVar6;
  size_type sVar7;
  const_reference pvVar8;
  uint *puVar9;
  const_reference pvVar10;
  const_reference pvVar11;
  TestLog *pTVar12;
  bool local_e85;
  allocator<char> local_dc1;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  LogImage local_d78;
  allocator<char> local_ce1;
  string local_ce0;
  allocator<char> local_cb9;
  string local_cb8;
  LogImageSet local_c98;
  MessageBuilder local_c58;
  undefined4 local_ad8;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  LogImage local_a88;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  LogImage local_9a8;
  allocator<char> local_911;
  string local_910;
  allocator<char> local_8e9;
  string local_8e8;
  LogImageSet local_8c8;
  MessageBuilder local_888;
  MessageBuilder local_708;
  deUint32 local_588;
  deUint32 local_584;
  int local_580;
  deUint32 local_57c;
  PixelBufferAccess local_578;
  undefined1 local_54c [24];
  CoverageType referenceCoverage;
  bool imageFullCoverage;
  int iStack_530;
  bool imageNoCoverage;
  RGBA color;
  int x_1;
  int y_1;
  PixelBufferAccess local_518;
  Vector<int,_4> local_4f0;
  PixelBufferAccess local_4e0;
  Vector<int,_2> local_4b4;
  int local_4ac;
  byte local_4a5;
  int friendTriNdx;
  bool friendFound;
  int local_49c;
  CoverageType resultCoverage;
  PixelBufferAccess local_488;
  Vector<int,_2> local_45c;
  CoverageType local_454;
  CoverageType coverage;
  undefined1 local_424 [24];
  int x;
  int y;
  IVec4 aabb;
  int triNdx;
  PixelBufferAccess local_3e8;
  MessageBuilder local_3c0;
  MessageBuilder local_240;
  undefined1 local_b0 [8];
  Surface errorMask;
  undefined1 local_90 [8];
  TextureLevel coverageMap;
  int subPixelBits;
  int unexpectedPixels;
  int missingPixels;
  IVec2 viewportSize;
  RGBA RStack_4c;
  bool multisampled;
  int weakVerificationThreshold;
  RGBA primitivePixelColor;
  RGBA partialPixelColor;
  RGBA unexpectedPixelColor;
  RGBA missingPixelColor;
  RGBA triangleColor;
  RGBA backGroundColor;
  VerificationMode mode_local;
  TestLog *log_local;
  RasterizationArguments *args_local;
  TriangleSceneSpec *scene_local;
  Surface *surface_local;
  
  RGBA::RGBA(&missingPixelColor,0,0,0,0xff);
  RGBA::RGBA(&unexpectedPixelColor,0xff,0xff,0xff,0xff);
  RGBA::RGBA(&partialPixelColor,0xff,0,0xff,0xff);
  RGBA::RGBA(&primitivePixelColor,0xff,0,0,0xff);
  RGBA::RGBA((RGBA *)&weakVerificationThreshold,0xff,0xff,0,0xff);
  RGBA::RGBA(&stack0xffffffffffffffb4,0x1e,0x1e,0x1e,0xff);
  viewportSize.m_data[1] = 10;
  viewportSize.m_data[0]._3_1_ = args->numSamples != 0;
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  Vector<int,_2>::Vector((Vector<int,_2> *)&unexpectedPixels,iVar4,iVar5);
  subPixelBits = 0;
  coverageMap.m_data.m_cap._4_4_ = 0;
  coverageMap.m_data.m_cap._0_4_ = args->subpixelBits;
  this = &errorMask.m_pixels.m_cap;
  TextureFormat::TextureFormat((TextureFormat *)this,R,UNSIGNED_INT8);
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  TextureLevel::TextureLevel((TextureLevel *)local_90,(TextureFormat *)this,iVar4,iVar5,1);
  iVar4 = Surface::getWidth(surface);
  iVar5 = Surface::getHeight(surface);
  Surface::Surface((Surface *)local_b0,iVar4,iVar5);
  if ((int)coverageMap.m_data.m_cap < 0) {
    TestLog::operator<<(&local_240,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<(&local_240,(char (*) [25])"Invalid subpixel count (");
    pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&coverageMap.m_data.m_cap);
    pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [14])"), assuming 0");
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_240);
    coverageMap.m_data.m_cap._0_4_ = 0;
  }
  else if (0x10 < (int)coverageMap.m_data.m_cap) {
    TestLog::operator<<(&local_3c0,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<
                       (&local_3c0,(char (*) [36])"Subpixel count is greater than 16 (");
    pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&coverageMap.m_data.m_cap);
    pMVar6 = MessageBuilder::operator<<
                       (pMVar6,(char (*) [93])
                               "). Checking results using less strict 16 bit requirements. This may produce false positives."
                       );
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_3c0);
    coverageMap.m_data.m_cap._0_4_ = 0x10;
  }
  TextureLevel::getAccess(&local_3e8,(TextureLevel *)local_90);
  Vector<int,_4>::Vector((Vector<int,_4> *)(aabb.m_data + 3),2,0,0,0);
  clear(&local_3e8,(IVec4 *)(aabb.m_data + 3));
  aabb.m_data[2] = 0;
  do {
    iVar4 = aabb.m_data[2];
    sVar7 = std::
            vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            ::size(&scene->triangles);
    if ((int)sVar7 <= iVar4) {
      Surface::getAccess(&local_518,(Surface *)local_b0);
      Vector<float,_4>::Vector((Vector<float,_4> *)&x_1,0.0,0.0,0.0,1.0);
      clear(&local_518,(Vec4 *)&x_1);
      for (color.m_value = 0; RVar1.m_value = color.m_value, iVar4 = Surface::getHeight(surface),
          (int)RVar1.m_value < iVar4; color.m_value = color.m_value + 1) {
        for (iStack_530 = 0; iVar4 = iStack_530, iVar5 = Surface::getWidth(surface), iVar4 < iVar5;
            iStack_530 = iStack_530 + 1) {
          referenceCoverage = (CoverageType)Surface::getPixel(surface,iStack_530,color.m_value);
          local_54c[0x17] =
               anon_unknown_3::compareColors
                         ((RGBA *)&referenceCoverage,&missingPixelColor,args->redBits,
                          args->greenBits,args->blueBits);
          local_54c[0x16] =
               anon_unknown_3::compareColors
                         ((RGBA *)&referenceCoverage,&unexpectedPixelColor,args->redBits,
                          args->greenBits,args->blueBits);
          TextureLevel::getAccess(&local_578,(TextureLevel *)local_90);
          ConstPixelBufferAccess::getPixelUint
                    ((ConstPixelBufferAccess *)local_54c,(int)&local_578,iStack_530,color.m_value);
          puVar9 = Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_54c);
          local_54c._16_4_ = *puVar9;
          if (local_54c._16_4_ == 0) {
            if ((local_54c[0x16] & 1) == 0) {
              subPixelBits = subPixelBits + 1;
              local_584 = partialPixelColor.m_value;
              Surface::setPixel((Surface *)local_b0,iStack_530,color.m_value,partialPixelColor);
            }
            else {
              local_588 = RStack_4c.m_value;
              Surface::setPixel((Surface *)local_b0,iStack_530,color.m_value,RStack_4c);
            }
          }
          else if (local_54c._16_4_ == 1) {
            local_580 = weakVerificationThreshold;
            Surface::setPixel((Surface *)local_b0,iStack_530,color.m_value,
                              (RGBA)weakVerificationThreshold);
          }
          else if ((local_54c._16_4_ == 2) && ((local_54c[0x17] & 1) == 0)) {
            coverageMap.m_data.m_cap._4_4_ = coverageMap.m_data.m_cap._4_4_ + 1;
            local_57c = primitivePixelColor.m_value;
            Surface::setPixel((Surface *)local_b0,iStack_530,color.m_value,primitivePixelColor);
          }
        }
      }
      TestLog::operator<<(&local_708,log,(BeginMessageToken *)&TestLog::Message);
      pMVar6 = MessageBuilder::operator<<
                         (&local_708,(char (*) [32])"Verifying rasterization result.");
      MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
      MessageBuilder::~MessageBuilder(&local_708);
      if (((mode == VERIFICATIONMODE_STRICT) && (0 < subPixelBits + coverageMap.m_data.m_cap._4_4_))
         || ((mode == VERIFICATIONMODE_WEAK && (10 < subPixelBits + coverageMap.m_data.m_cap._4_4_))
            )) {
        TestLog::operator<<(&local_888,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_888,(char (*) [24])"Invalid pixels found:\n\t");
        pMVar6 = MessageBuilder::operator<<(pMVar6,&subPixelBits);
        pMVar6 = MessageBuilder::operator<<
                           (pMVar6,(char (*) [40])" missing pixels. (Marked with purple)\n\t");
        pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)((long)&coverageMap.m_data.m_cap + 4));
        pMVar6 = MessageBuilder::operator<<
                           (pMVar6,(char (*) [48])
                                   " incorrectly filled pixels. (Marked with red)\n\t");
        pMVar6 = MessageBuilder::operator<<
                           (pMVar6,(char (*) [58])
                                   "Unknown (subpixel on edge) pixels are marked with yellow.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_888);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e8,"Verification result",&local_8e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_910,"Result of rendering",&local_911);
        LogImageSet::LogImageSet(&local_8c8,&local_8e8,&local_910);
        pTVar12 = TestLog::operator<<(log,&local_8c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9c8,"Result",&local_9c9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9f0,"Result",&local_9f1)
        ;
        LogImage::LogImage(&local_9a8,&local_9c8,&local_9f0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_9a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_aa8,"ErrorMask",&local_aa9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ad0,"ErrorMask",&local_ad1);
        LogImage::LogImage(&local_a88,&local_aa8,&local_ad0,(Surface *)local_b0,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_a88);
        TestLog::operator<<(pTVar12,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_a88);
        std::__cxx11::string::~string((string *)&local_ad0);
        std::allocator<char>::~allocator(&local_ad1);
        std::__cxx11::string::~string((string *)&local_aa8);
        std::allocator<char>::~allocator(&local_aa9);
        LogImage::~LogImage(&local_9a8);
        std::__cxx11::string::~string((string *)&local_9f0);
        std::allocator<char>::~allocator(&local_9f1);
        std::__cxx11::string::~string((string *)&local_9c8);
        std::allocator<char>::~allocator(&local_9c9);
        LogImageSet::~LogImageSet(&local_8c8);
        std::__cxx11::string::~string((string *)&local_910);
        std::allocator<char>::~allocator(&local_911);
        std::__cxx11::string::~string((string *)&local_8e8);
        std::allocator<char>::~allocator(&local_8e9);
        surface_local._7_1_ = false;
      }
      else {
        TestLog::operator<<(&local_c58,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_c58,(char (*) [25])"No invalid pixels found.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_c58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_cb8,"Verification result",&local_cb9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ce0,"Result of rendering",&local_ce1);
        LogImageSet::LogImageSet(&local_c98,&local_cb8,&local_ce0);
        pTVar12 = TestLog::operator<<(log,&local_c98);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"Result",&local_d99)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_dc0,"Result",&local_dc1)
        ;
        LogImage::LogImage(&local_d78,&local_d98,&local_dc0,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_d78);
        TestLog::operator<<(pTVar12,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_d78);
        std::__cxx11::string::~string((string *)&local_dc0);
        std::allocator<char>::~allocator(&local_dc1);
        std::__cxx11::string::~string((string *)&local_d98);
        std::allocator<char>::~allocator(&local_d99);
        LogImageSet::~LogImageSet(&local_c98);
        std::__cxx11::string::~string((string *)&local_ce0);
        std::allocator<char>::~allocator(&local_ce1);
        std::__cxx11::string::~string((string *)&local_cb8);
        std::allocator<char>::~allocator(&local_cb9);
        surface_local._7_1_ = true;
      }
      local_ad8 = 1;
      Surface::~Surface((Surface *)local_b0);
      TextureLevel::~TextureLevel((TextureLevel *)local_90);
      return surface_local._7_1_;
    }
    pvVar8 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[](&scene->triangles,(long)aabb.m_data[2]);
    anon_unknown_3::getTriangleAABB((anon_unknown_3 *)&x,pvVar8,(IVec2 *)&unexpectedPixels);
    iVar4 = Vector<int,_4>::y((Vector<int,_4> *)&x);
    local_424._20_4_ = de::max<int>(0,iVar4);
    while( true ) {
      uVar2 = local_424._20_4_;
      iVar4 = Vector<int,_4>::w((Vector<int,_4> *)&x);
      iVar5 = TextureLevel::getHeight((TextureLevel *)local_90);
      iVar4 = de::min<int>(iVar4,iVar5 + -1);
      if (iVar4 < (int)uVar2) break;
      iVar4 = Vector<int,_4>::x((Vector<int,_4> *)&x);
      local_424._16_4_ = de::max<int>(0,iVar4);
      while( true ) {
        uVar2 = local_424._16_4_;
        iVar4 = Vector<int,_4>::z((Vector<int,_4> *)&x);
        iVar5 = TextureLevel::getWidth((TextureLevel *)local_90);
        iVar4 = de::min<int>(iVar4,iVar5 + -1);
        if (iVar4 < (int)uVar2) break;
        TextureLevel::getAccess
                  ((PixelBufferAccess *)&stack0xfffffffffffffbb0,(TextureLevel *)local_90);
        ConstPixelBufferAccess::getPixelUint
                  ((ConstPixelBufferAccess *)local_424,(int)&stack0xfffffffffffffbb0,
                   local_424._16_4_,local_424._20_4_);
        puVar9 = Vector<unsigned_int,_4>::x((Vector<unsigned_int,_4> *)local_424);
        if (*puVar9 != 0) {
          pvVar8 = std::
                   vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   ::operator[](&scene->triangles,(long)aabb.m_data[2]);
          pvVar10 = std::
                    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ::operator[](&scene->triangles,(long)aabb.m_data[2]);
          pvVar11 = std::
                    vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ::operator[](&scene->triangles,(long)aabb.m_data[2]);
          Vector<int,_2>::Vector(&local_45c,local_424._16_4_,local_424._20_4_);
          local_454 = calculateTriangleCoverage
                                (pvVar8->positions,pvVar10->positions + 1,pvVar11->positions + 2,
                                 &local_45c,(IVec2 *)&unexpectedPixels,(int)coverageMap.m_data.m_cap
                                 ,(bool)(viewportSize.m_data[0]._3_1_ & 1));
          if (local_454 == COVERAGE_FULL) {
            TextureLevel::getAccess(&local_488,(TextureLevel *)local_90);
            Vector<int,_4>::Vector((Vector<int,_4> *)&stack0xfffffffffffffb68,0,0,0,0);
            PixelBufferAccess::setPixel
                      (&local_488,(IVec4 *)&stack0xfffffffffffffb68,local_424._16_4_,
                       local_424._20_4_,0);
          }
          else if (local_454 == COVERAGE_PARTIAL) {
            local_49c = 1;
            Vector<int,_2>::Vector
                      ((Vector<int,_2> *)&friendTriNdx,local_424._16_4_,local_424._20_4_);
            pvVar8 = std::
                     vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     ::operator[](&scene->triangles,(long)aabb.m_data[2]);
            bVar3 = anon_unknown_3::pixelOnlyOnASharedEdge
                              ((IVec2 *)&friendTriNdx,pvVar8,(IVec2 *)&unexpectedPixels);
            if (bVar3) {
              local_4a5 = 0;
              for (local_4ac = 0; iVar4 = local_4ac,
                  sVar7 = std::
                          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ::size(&scene->triangles), iVar4 < (int)sVar7; local_4ac = local_4ac + 1)
              {
                local_e85 = false;
                if (local_4ac != aabb.m_data[2]) {
                  Vector<int,_2>::Vector(&local_4b4,local_424._16_4_,local_424._20_4_);
                  pvVar8 = std::
                           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                           ::operator[](&scene->triangles,(long)local_4ac);
                  local_e85 = anon_unknown_3::pixelOnlyOnASharedEdge
                                        (&local_4b4,pvVar8,(IVec2 *)&unexpectedPixels);
                }
                if (local_e85 != false) {
                  local_4a5 = 1;
                  break;
                }
              }
              if ((local_4a5 & 1) != 0) {
                local_49c = 0;
              }
            }
            TextureLevel::getAccess(&local_4e0,(TextureLevel *)local_90);
            Vector<int,_4>::Vector(&local_4f0,local_49c,0,0,0);
            PixelBufferAccess::setPixel(&local_4e0,&local_4f0,local_424._16_4_,local_424._20_4_,0);
          }
        }
        local_424._16_4_ = local_424._16_4_ + 1;
      }
      local_424._20_4_ = local_424._20_4_ + 1;
    }
    aabb.m_data[2] = aabb.m_data[2] + 1;
  } while( true );
}

Assistant:

bool verifyTriangleGroupRasterization (const tcu::Surface& surface, const TriangleSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log, VerificationMode mode)
{
	DE_ASSERT(mode < VERIFICATIONMODE_LAST);

	const tcu::RGBA		backGroundColor				= tcu::RGBA(0, 0, 0, 255);
	const tcu::RGBA		triangleColor				= tcu::RGBA(255, 255, 255, 255);
	const tcu::RGBA		missingPixelColor			= tcu::RGBA(255, 0, 255, 255);
	const tcu::RGBA		unexpectedPixelColor		= tcu::RGBA(255, 0, 0, 255);
	const tcu::RGBA		partialPixelColor			= tcu::RGBA(255, 255, 0, 255);
	const tcu::RGBA		primitivePixelColor			= tcu::RGBA(30, 30, 30, 255);
	const int			weakVerificationThreshold	= 10;
	const bool			multisampled				= (args.numSamples != 0);
	const tcu::IVec2	viewportSize				= tcu::IVec2(surface.getWidth(), surface.getHeight());
	int					missingPixels				= 0;
	int					unexpectedPixels			= 0;
	int					subPixelBits				= args.subpixelBits;
	tcu::TextureLevel	coverageMap					(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());
	tcu::Surface		errorMask					(surface.getWidth(), surface.getHeight());

	// subpixel bits in in a valid range?

	if (subPixelBits < 0)
	{
		log << tcu::TestLog::Message << "Invalid subpixel count (" << subPixelBits << "), assuming 0" << tcu::TestLog::EndMessage;
		subPixelBits = 0;
	}
	else if (subPixelBits > 16)
	{
		// At high subpixel bit counts we might overflow. Checking at lower bit count is ok, but is less strict
		log << tcu::TestLog::Message << "Subpixel count is greater than 16 (" << subPixelBits << "). Checking results using less strict 16 bit requirements. This may produce false positives." << tcu::TestLog::EndMessage;
		subPixelBits = 16;
	}

	// generate coverage map

	tcu::clear(coverageMap.getAccess(), tcu::IVec4(COVERAGE_NONE, 0, 0, 0));

	for (int triNdx = 0; triNdx < (int)scene.triangles.size(); ++triNdx)
	{
		const tcu::IVec4 aabb = getTriangleAABB(scene.triangles[triNdx], viewportSize);

		for (int y = de::max(0, aabb.y()); y <= de::min(aabb.w(), coverageMap.getHeight() - 1); ++y)
		for (int x = de::max(0, aabb.x()); x <= de::min(aabb.z(), coverageMap.getWidth() - 1); ++x)
		{
			if (coverageMap.getAccess().getPixelUint(x, y).x() == COVERAGE_FULL)
				continue;

			const CoverageType coverage = calculateTriangleCoverage(scene.triangles[triNdx].positions[0],
																	scene.triangles[triNdx].positions[1],
																	scene.triangles[triNdx].positions[2],
																	tcu::IVec2(x, y),
																	viewportSize,
																	subPixelBits,
																	multisampled);

			if (coverage == COVERAGE_FULL)
			{
				coverageMap.getAccess().setPixel(tcu::IVec4(COVERAGE_FULL, 0, 0, 0), x, y);
			}
			else if (coverage == COVERAGE_PARTIAL)
			{
				CoverageType resultCoverage = COVERAGE_PARTIAL;

				// Sharing an edge with another triangle?
				// There should always be such a triangle, but the pixel in the other triangle might be
				// on multiple edges, some of which are not shared. In these cases the coverage cannot be determined.
				// Assume full coverage if the pixel is only on a shared edge in shared triangle too.
				if (pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[triNdx], viewportSize))
				{
					bool friendFound = false;
					for (int friendTriNdx = 0; friendTriNdx < (int)scene.triangles.size(); ++friendTriNdx)
					{
						if (friendTriNdx != triNdx && pixelOnlyOnASharedEdge(tcu::IVec2(x, y), scene.triangles[friendTriNdx], viewportSize))
						{
							friendFound = true;
							break;
						}
					}

					if (friendFound)
						resultCoverage = COVERAGE_FULL;
				}

				coverageMap.getAccess().setPixel(tcu::IVec4(resultCoverage, 0, 0, 0), x, y);
			}
		}
	}

	// check pixels

	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (int y = 0; y < surface.getHeight(); ++y)
	for (int x = 0; x < surface.getWidth(); ++x)
	{
		const tcu::RGBA		color				= surface.getPixel(x, y);
		const bool			imageNoCoverage		= compareColors(color, backGroundColor, args.redBits, args.greenBits, args.blueBits);
		const bool			imageFullCoverage	= compareColors(color, triangleColor, args.redBits, args.greenBits, args.blueBits);
		CoverageType		referenceCoverage	= (CoverageType)coverageMap.getAccess().getPixelUint(x, y).x();

		switch (referenceCoverage)
		{
			case COVERAGE_NONE:
				if (!imageNoCoverage)
				{
					// coverage where there should not be
					++unexpectedPixels;
					errorMask.setPixel(x, y, unexpectedPixelColor);
				}
				break;

			case COVERAGE_PARTIAL:
				// anything goes
				errorMask.setPixel(x, y, partialPixelColor);
				break;

			case COVERAGE_FULL:
				if (!imageFullCoverage)
				{
					// no coverage where there should be
					++missingPixels;
					errorMask.setPixel(x, y, missingPixelColor);
				}
				else
				{
					errorMask.setPixel(x, y, primitivePixelColor);
				}
				break;

			default:
				DE_ASSERT(false);
		};
	}

	// Output results
	log << tcu::TestLog::Message << "Verifying rasterization result." << tcu::TestLog::EndMessage;

	if (((mode == VERIFICATIONMODE_STRICT) && (missingPixels + unexpectedPixels > 0)) ||
		((mode == VERIFICATIONMODE_WEAK)   && (missingPixels + unexpectedPixels > weakVerificationThreshold)))
	{
		log << tcu::TestLog::Message << "Invalid pixels found:\n\t"
			<< missingPixels << " missing pixels. (Marked with purple)\n\t"
			<< unexpectedPixels << " incorrectly filled pixels. (Marked with red)\n\t"
			<< "Unknown (subpixel on edge) pixels are marked with yellow."
			<< tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result",	"Result",		surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}